

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional_test.cxx
# Opt level: O3

vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
* gen_kern_vector<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
            (vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             *__return_storage_ptr__,Backend backend,Spin polar,double *args,Kernel *args_1,
            double *args_2,Kernel *args_3)

{
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gen_kern_vector(&local_38,backend,polar,*args,*args_1);
  gen_kern_vector(&local_38,backend,polar,*args_2,*args_3);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto gen_kern_vector( Backend backend, Spin polar, Args&&... args ) {
  std::vector< std::pair<double, XCKernel> > vec;
  gen_kern_vector( vec, backend, polar, std::forward<Args>(args)... );
  return vec;
}